

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O1

void doaltarobj(obj *obj)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  obj *local_40;
  obj *local_38;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    if (ublindf == (obj *)0x0) {
      return;
    }
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  u.uconduct.gnostic = u.uconduct.gnostic + 1;
  if (((*(uint *)&obj->field_0x4a & 3) == 0) || (obj->oclass == '\f')) {
    pcVar4 = Doname2(obj);
    pcVar5 = otense(obj,"land");
    pline("%s %s on the altar.",pcVar4,pcVar5);
  }
  else {
    pcVar4 = "amber";
    if ((*(uint *)&obj->field_0x4a & 2) == 0) {
      pcVar4 = "black";
    }
    pcVar4 = hcolor(pcVar4);
    pcVar4 = an(pcVar4);
    pcVar5 = doname(obj);
    pcVar6 = otense(obj,"hit");
    pline("There is %s flash as %s %s the altar.",pcVar4,pcVar5,pcVar6);
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0'))))
    goto LAB_0016e5e6;
  }
  obj->field_0x4a = obj->field_0x4a | 0x40;
LAB_0016e5e6:
  if (obj->cobj != (obj *)0x0) {
    iVar7 = 0;
    local_38 = obj->cobj;
    do {
      poVar1 = local_38->nobj;
      iVar7 = (iVar7 + 1) - (uint)((local_38->field_0x4a & 3) == 0);
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        *(uint *)&local_38->field_0x4a = *(uint *)&local_38->field_0x4a | 0x40;
        local_40 = obj->cobj;
        while ((local_40 != (obj *)0x0 &&
               ((local_40 == local_38 || (iVar3 = merged(&local_40,&local_38), iVar3 == 0))))) {
          local_40 = local_40->nobj;
        }
      }
      local_38 = poVar1;
    } while (poVar1 != (obj *)0x0);
    if (iVar7 != 0) {
      if (iVar7 == 1) {
        pcVar4 = "Looking inside %s, you see a colored flash.";
      }
      else {
        pcVar4 = "Looking inside %s, you see colored flashes.";
      }
      pcVar5 = xname(obj);
      pcVar5 = the(pcVar5);
      pline(pcVar4,pcVar5);
    }
  }
  return;
}

Assistant:

void doaltarobj(struct obj *obj)  /* obj is an object dropped on an altar */
{
	if (Blind)
		return;

	/* KMH, conduct */
	u.uconduct.gnostic++;

	if ((obj->blessed || obj->cursed) && obj->oclass != COIN_CLASS) {
		pline("There is %s flash as %s %s the altar.",
			an(hcolor(obj->blessed ? "amber" : "black")),
			doname(obj), otense(obj, "hit"));
		if (!Hallucination) obj->bknown = 1;
	} else {
		pline("%s %s on the altar.", Doname2(obj),
			otense(obj, "land"));
		obj->bknown = 1;
	}

	/* Also BUC one level deep inside containers. */
	if (Has_contents(obj)) {
	    struct obj *otmp, *otmp2, *otmp_nobj;
	    int buccount = 0;
	    for (otmp = obj->cobj; otmp; ) {
		/* Ensure next otmp in case otmp is merged
		 * and thus freed and unusable. */
		otmp_nobj = otmp->nobj;
		if (otmp->blessed || otmp->cursed)
		    buccount++;
		if (!Hallucination) {
		    otmp->bknown = 1;
		    /* Merge obj with a contained object if possible,
		     * so objects of the same BUC but different BUC-known state
		     * don't form separate stacks in the container. */
		    for (otmp2 = obj->cobj; otmp2; otmp2 = otmp2->nobj)
			if (otmp2 != otmp && merged(&otmp2, &otmp))
			    break;
		}
		otmp = otmp_nobj;
	    }
	    if (buccount == 1) {
		pline("Looking inside %s, you see a colored flash.",
		      the(xname(obj)));
	    } else if (buccount > 1) {
		pline("Looking inside %s, you see colored flashes.",
		      the(xname(obj)));
	    }
	}
}